

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_front_by_singe_char_Test<char32_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_front_by_singe_char_Test<char32_t> *this)

{
  bool bVar1;
  char32_t delim;
  char32_t *pcVar2;
  char *message;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_R9;
  split_helper_get_front<char32_t> sVar3;
  AssertionHelper local_248;
  Fixed local_208;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_80;
  undefined1 local_70 [8];
  AssertionResult iutest_ar;
  split_helper_get_front<char32_t> local_40;
  undefined1 local_30 [8];
  b_str_view<char32_t> re;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> s;
  iu_StringViewSplit_x_iutest_x_chain_front_by_singe_char_Test<char32_t> *this_local;
  
  pcVar2 = constant::cpp_basic_istream<char32_t>();
  std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::basic_string_view
            ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&re._M_str,pcVar2);
  delim = constant::space<char32_t>();
  iutest_ar._36_4_ = split<char32_t,_nullptr>(delim);
  front();
  sVar3 = detail::split_helper<char32_t,_true,_false,_false>::operator>>
                    ((split_helper<char32_t,_true,_false,_false> *)&iutest_ar.field_0x24);
  local_40.super_split_helper_index<char32_t,_true,_false,_false>.index =
       sVar3.super_split_helper_index<char32_t,_true,_false,_false>.index;
  local_40.super_split_helper_index<char32_t,_true,_false,_false>.delim =
       sVar3.super_split_helper_index<char32_t,_true,_false,_false>.delim;
  _local_30 = detail::operator|((b_str_view<char32_t> *)&re._M_str,&local_40);
  iutest::detail::AlwaysZero();
  pcVar2 = constant::cpp_basic_istream_part<char32_t>();
  std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::basic_string_view(&local_80,pcVar2)
  ;
  iutest::internal::EqHelper<false>::
  Compare<std::basic_string_view<char32_t,std::char_traits<char32_t>>>
            ((AssertionResult *)local_70,
             (EqHelper<false> *)
             "std::basic_string_view<char_type>(constant::cpp_basic_istream_part<char_type>())","re"
             ,(char *)&local_80,(basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_30
             ,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    memset(&local_208,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_208);
    message = iutest::AssertionResult::message((AssertionResult *)local_70);
    iutest::AssertionHelper::AssertionHelper
              (&local_248,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x16,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_248,&local_208);
    iutest::AssertionHelper::~AssertionHelper(&local_248);
    iutest::AssertionHelper::Fixed::~Fixed(&local_208);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_front_by_singe_char)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::cpp_basic_istream<char_type>();
	const auto re = s | split(constant::space<char_type>()) >> front();
	IUTEST_ASSERT_EQ(std::basic_string_view<char_type>(constant::cpp_basic_istream_part<char_type>()), re);
}